

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O2

int easm_cfold_expr(easm_expr *expr)

{
  easm_expr **ppeVar1;
  int iVar2;
  easm_expr *expr_00;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  if (expr->type == EASM_EXPR_NUM) {
    return 1;
  }
  bVar5 = true;
  bVar4 = true;
  if (expr->e1 != (easm_expr *)0x0) {
    iVar2 = easm_cfold_expr(expr->e1);
    bVar4 = iVar2 != 0;
  }
  if (expr->e2 != (easm_expr *)0x0) {
    iVar2 = easm_cfold_expr(expr->e2);
    bVar5 = iVar2 != 0;
  }
  if (expr->sinsn != (easm_sinsn *)0x0) {
    easm_cfold_sinsn(expr->sinsn);
  }
  if (!(bool)(bVar4 & bVar5)) {
    return 0;
  }
  if (expr->type - EASM_EXPR_NUM < 0xfffffff1) {
    return 0;
  }
  ppeVar1 = &expr->e1;
  switch(expr->type) {
  case EASM_EXPR_LOR:
    expr_00 = *ppeVar1;
    if (expr_00->num != 0) {
      uVar3 = 1;
      break;
    }
    goto LAB_00261598;
  case EASM_EXPR_LAND:
    expr_00 = *ppeVar1;
    if (expr_00->num == 0) {
      uVar3 = 0;
      break;
    }
LAB_00261598:
    uVar3 = (ulong)(expr->e2->num != 0);
    break;
  case EASM_EXPR_OR:
    expr_00 = expr->e1;
    uVar3 = expr->e2->num | expr_00->num;
    break;
  case EASM_EXPR_XOR:
    expr_00 = expr->e1;
    uVar3 = expr->e2->num ^ expr_00->num;
    break;
  case EASM_EXPR_AND:
    expr_00 = expr->e1;
    uVar3 = expr->e2->num & expr_00->num;
    break;
  case EASM_EXPR_SHL:
    expr_00 = expr->e1;
    uVar3 = expr_00->num << ((byte)expr->e2->num & 0x3f);
    break;
  case EASM_EXPR_SHR:
    expr_00 = expr->e1;
    uVar3 = expr_00->num >> ((byte)expr->e2->num & 0x3f);
    break;
  case EASM_EXPR_ADD:
    expr_00 = expr->e1;
    uVar3 = expr->e2->num + expr_00->num;
    break;
  case EASM_EXPR_SUB:
    expr_00 = expr->e1;
    uVar3 = expr_00->num - expr->e2->num;
    break;
  case EASM_EXPR_MUL:
    expr_00 = expr->e1;
    uVar3 = expr->e2->num * expr_00->num;
    break;
  case EASM_EXPR_DIV:
    uVar3 = expr->e2->num;
    if (uVar3 == 0) {
LAB_00261638:
      fprintf(_stderr,"%s:%d.%d-%d.%d: Division by 0\n",(expr->loc).file,
              (ulong)(uint)(expr->loc).lstart,(ulong)(uint)(expr->loc).cstart,
              (ulong)(uint)(expr->loc).lend,(expr->loc).cend);
      return 0;
    }
    expr_00 = *ppeVar1;
    uVar3 = expr_00->num / uVar3;
    break;
  case EASM_EXPR_MOD:
    uVar3 = expr->e2->num;
    if (uVar3 == 0) goto LAB_00261638;
    expr_00 = *ppeVar1;
    uVar3 = expr_00->num % uVar3;
    break;
  case EASM_EXPR_NEG:
    expr_00 = *ppeVar1;
    uVar3 = -expr_00->num;
    break;
  case EASM_EXPR_NOT:
    expr_00 = *ppeVar1;
    uVar3 = ~expr_00->num;
    break;
  case EASM_EXPR_LNOT:
    expr_00 = *ppeVar1;
    uVar3 = (ulong)(expr_00->num == 0);
  }
  easm_del_expr(expr_00);
  easm_del_expr(expr->e2);
  *ppeVar1 = (easm_expr *)0x0;
  expr->e2 = (easm_expr *)0x0;
  expr->num = uVar3;
  expr->type = EASM_EXPR_NUM;
  return 1;
}

Assistant:

int easm_cfold_expr(struct easm_expr *expr) {
	if (expr->type == EASM_EXPR_NUM)
		return 1;
	int e1f = 1, e2f = 1;
	if (expr->e1)
		e1f = easm_cfold_expr(expr->e1);
	if (expr->e2)
		e2f = easm_cfold_expr(expr->e2);
	if (expr->sinsn)
		easm_cfold_sinsn(expr->sinsn);
	if (!e1f || !e2f || expr->type < EASM_EXPR_LOR || expr->type > EASM_EXPR_LNOT)
		return 0;
	uint64_t val;
	uint64_t x;
	switch (expr->type) {
		case EASM_EXPR_NEG:
			val = -expr->e1->num;
			break;
		case EASM_EXPR_NOT:
			val = ~expr->e1->num;
			break;
		case EASM_EXPR_LNOT:
			val = !expr->e1->num;
			break;
		case EASM_EXPR_MUL:
			val = expr->e1->num * expr->e2->num;
			break;
		case EASM_EXPR_DIV:
			x = expr->e2->num;
			if (x)
				val = expr->e1->num / x;
			else {
				fprintf (stderr, LOC_FORMAT(expr->loc, "Division by 0\n"));
				return 0;
			}
			break;
		case EASM_EXPR_MOD:
			x = expr->e2->num;
			if (x)
				val = expr->e1->num % x;
			else {
				fprintf (stderr, LOC_FORMAT(expr->loc, "Division by 0\n"));
				return 0;
			}
			break;
		case EASM_EXPR_ADD:
			val = expr->e1->num + expr->e2->num;
			break;
		case EASM_EXPR_SUB:
			val = expr->e1->num - expr->e2->num;
			break;
		case EASM_EXPR_SHL:
			val = expr->e1->num << expr->e2->num;
			break;
		case EASM_EXPR_SHR:
			val = expr->e1->num >> expr->e2->num;
			break;
		case EASM_EXPR_AND:
			val = expr->e1->num & expr->e2->num;
			break;
		case EASM_EXPR_XOR:
			val = expr->e1->num ^ expr->e2->num;
			break;
		case EASM_EXPR_OR:
			val = expr->e1->num | expr->e2->num;
			break;
		case EASM_EXPR_LAND:
			val = expr->e1->num && expr->e2->num;
			break;
		case EASM_EXPR_LOR:
			val = expr->e1->num || expr->e2->num;
			break;
		default:
			abort();
	}
	easm_del_expr(expr->e1);
	easm_del_expr(expr->e2);
	expr->e1 = 0;
	expr->e2 = 0;
	expr->num = val;
	expr->type = EASM_EXPR_NUM;
	return 1;
}